

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

void __thiscall
S2Polyline::S2Polyline
          (S2Polyline *this,vector<S2LatLng,_std::allocator<S2LatLng>_> *vertices,S2Debug override)

{
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polyline_00305cd0;
  this->s2debug_override_ = override;
  this->num_vertices_ = 0;
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = (Vector3<double> *)0x0;
  Init(this,vertices);
  return;
}

Assistant:

S2Polyline::S2Polyline(const vector<S2LatLng>& vertices,
                       S2Debug override)
  : s2debug_override_(override) {
  Init(vertices);
}